

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

mpack_node_t mpack_node_map_at(mpack_node_t node,size_t index,size_t offset)

{
  mpack_error_t error;
  mpack_tree_t *tree;
  mpack_node_data_t *pmVar1;
  mpack_node_t mVar2;
  
  tree = node.tree;
  pmVar1 = node.data;
  if (tree->error == mpack_ok) {
    if (pmVar1->type == mpack_type_map) {
      if (index < pmVar1->len) {
        pmVar1 = (pmVar1->value).children + index * 2 + offset;
        goto LAB_00104ddd;
      }
      error = mpack_error_data;
    }
    else {
      error = mpack_error_type;
    }
    mpack_tree_flag_error(tree,error);
  }
  pmVar1 = &tree->nil_node;
LAB_00104ddd:
  mVar2.tree = tree;
  mVar2.data = pmVar1;
  return mVar2;
}

Assistant:

MPACK_INLINE mpack_node_t mpack_node_map_at(mpack_node_t node, size_t index, size_t offset) {
    if (mpack_node_error(node) != mpack_ok)
        return mpack_tree_nil_node(node.tree);

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return mpack_tree_nil_node(node.tree);
    }

    if (index >= node.data->len) {
        mpack_node_flag_error(node, mpack_error_data);
        return mpack_tree_nil_node(node.tree);
    }

    return mpack_node(node.tree, mpack_node_child(node, index * 2 + offset));
}